

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetObjectFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  long *plVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  long *local_100;
  undefined8 local_f8;
  long local_f0 [2];
  long *local_e0;
  size_t local_d8;
  long local_d0 [2];
  string local_c0;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined8 local_60;
  long *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  size_type local_40;
  pointer local_38;
  
  pcVar1 = this->LocalGenerator;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->HomeRelativeOutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->HomeRelativeOutputPath)._M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  psVar4 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_e0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  plVar3 = local_e0;
  pcVar5 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_100,pcVar5,config);
  local_70._M_len = local_d8;
  local_70._M_str = (char *)plVar3;
  local_60 = local_f8;
  local_58 = local_100;
  local_98 = local_90;
  local_a0 = 1;
  local_90[0] = 0x2f;
  local_50 = 1;
  local_38 = (psVar4->_M_dataplus)._M_p;
  local_40 = psVar4->_M_string_length;
  views._M_len = 4;
  views._M_array = &local_70;
  local_48 = local_98;
  cmCatViews_abi_cxx11_(&local_c0,views);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  std::string const& objectName = this->GeneratorTarget->GetObjectName(source);
  path += cmStrCat(
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
    this->GetGlobalGenerator()->ConfigDirectory(config), '/', objectName);
  return path;
}